

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test25(void)

{
  CMReturn In;
  long lVar1;
  allocator<char> local_2289;
  string local_2288;
  string local_2268;
  CMReturn local_2248;
  allocator<char> local_2229;
  string local_2228;
  string local_2208;
  allocator<char> local_21e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21a0;
  _CM_RETURN_STATUS local_217c;
  pointer local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  allocator<char> local_2139;
  string local_2138;
  string local_2118;
  undefined1 auStack_20f8 [8];
  CMReturn res;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20a0;
  undefined1 local_2088 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  allocator<char> local_41;
  string local_40 [8];
  string in;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  GetDefaultMap_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,
             "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB"
             ,&local_41);
  std::allocator<char>::~allocator(&local_41);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20a0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((long)&in.field_2 + 8));
  local_20d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_20d8._M_h._M_rehash_policy._4_4_ = 0;
  local_20d8._M_h._M_rehash_policy._M_next_resize = 0;
  local_20d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_20d8._M_h._M_element_count = 0;
  local_20d8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_20d8._M_h._M_bucket_count = 0;
  local_20d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_20d8);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_2088,&local_20a0,&local_20d8,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_20d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20a0);
  std::__cxx11::string::string((string *)&local_2118,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2138,"ASB",&local_2139);
  local_2158 = 0;
  uStack_2150 = 0;
  local_2168 = 0;
  uStack_2160 = 1;
  local_2178 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2170 = 0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)auStack_20f8,(ConfusableMatcher *)local_2088,&local_2118,&local_2138,
             (CMOptions)
             ZEXT3248(CONCAT824(1,ZEXT824(matcher.TheMap[0xff].
                                          super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage))));
  std::__cxx11::string::~string((string *)&local_2138);
  std::allocator<char>::~allocator(&local_2139);
  std::__cxx11::string::~string((string *)&local_2118);
  local_217c = TIMEOUT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21e0,"Test25",&local_21e1);
  std::operator+(&local_21c0,&local_21e0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2228,"TIMEOUT == res.Status",&local_2229);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2208,&local_2228);
  std::operator+(&local_21a0,&local_21c0,&local_2208);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_217c,(_CM_RETURN_STATUS *)&res.Size,&local_21a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x28f);
  std::__cxx11::string::~string((string *)&local_21a0);
  std::__cxx11::string::~string((string *)&local_2208);
  std::__cxx11::string::~string((string *)&local_2228);
  std::allocator<char>::~allocator(&local_2229);
  std::__cxx11::string::~string((string *)&local_21c0);
  std::__cxx11::string::~string((string *)&local_21e0);
  std::allocator<char>::~allocator(&local_21e1);
  lVar1 = std::__cxx11::string::size();
  std::__cxx11::string::string((string *)&local_2268,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2288,"ASB",&local_2289);
  ConfusableMatcher::IndexOf
            (&local_2248,(ConfusableMatcher *)local_2088,&local_2268,&local_2288,
             (CMOptions)
             ZEXT3248(CONCAT824(1,CONCAT816(1,CONCAT88(lVar1 + -1,
                                                       matcher.TheMap[0xff].
                                                                                                              
                                                  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )))));
  res.Size = local_2248._16_8_;
  auStack_20f8 = (undefined1  [8])local_2248.Start;
  res.Start = local_2248.Size;
  std::__cxx11::string::~string((string *)&local_2288);
  std::allocator<char>::~allocator(&local_2289);
  std::__cxx11::string::~string((string *)&local_2268);
  In.Size = res.Start;
  In.Start = (uint64_t)auStack_20f8;
  In._16_8_ = res.Size;
  AssertMatch(In,0x5c,3);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_2088);
  std::__cxx11::string::~string(local_40);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&in.field_2 + 8));
  return;
}

Assistant:

void Test25()
{
	auto map = GetDefaultMap();

	std::string in = "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB";

	CMOptions opts = { };
	opts.MatchRepeating = true;
	opts.StartFromEnd = false;
	opts.TimeoutNs = 1;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf(in, "ASB", opts);
	ASSERT_EQUAL(TIMEOUT, res.Status);

	opts.StartFromEnd = true;
	opts.StartIndex = in.size() - 1;
	res = matcher.IndexOf(in, "ASB", opts);
	AssertMatch(res, 92, 3);
}